

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_Button.cxx
# Opt level: O2

void __thiscall Fl_Menu_Button::draw(Fl_Menu_Button *this)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Fl_Color FVar6;
  undefined8 in_RAX;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  undefined4 uVar12;
  
  uVar12 = (undefined4)((ulong)in_RAX >> 0x20);
  bVar1 = (this->super_Fl_Menu_).super_Fl_Widget.box_;
  if ((bVar1 != 0) && ((this->super_Fl_Menu_).super_Fl_Widget.type_ == '\0')) {
    iVar5 = (this->super_Fl_Menu_).super_Fl_Widget.w_;
    uVar7 = (this->super_Fl_Menu_).super_Fl_Widget.label_.size - 3;
    uVar11 = uVar7 & 0xfffffffe;
    iVar4 = (this->super_Fl_Menu_).super_Fl_Widget.x_;
    iVar2 = Fl::box_dx((uint)bVar1);
    iVar3 = Fl::box_dw((uint)(this->super_Fl_Menu_).super_Fl_Widget.box_);
    uVar8 = ~(iVar3 + iVar2 + uVar11) + iVar5 + iVar4;
    uVar10 = (int)((this->super_Fl_Menu_).super_Fl_Widget.h_ - uVar11) / 2 +
             (this->super_Fl_Menu_).super_Fl_Widget.y_;
    bVar1 = (this->super_Fl_Menu_).super_Fl_Widget.box_;
    Fl_Widget::draw_box((Fl_Widget *)this,
                        (uint)((1 < bVar1 && pressed_menu_button_ == this) | bVar1),
                        (this->super_Fl_Menu_).super_Fl_Widget.color_);
    iVar5 = (this->super_Fl_Menu_).super_Fl_Widget.x_;
    iVar4 = Fl::box_dx((uint)(this->super_Fl_Menu_).super_Fl_Widget.box_);
    Fl_Widget::draw_label
              ((Fl_Widget *)this,iVar5 + iVar4,(this->super_Fl_Menu_).super_Fl_Widget.y_,
               (uVar8 - (this->super_Fl_Menu_).super_Fl_Widget.x_) + 2,
               (this->super_Fl_Menu_).super_Fl_Widget.h_);
    if (Fl::focus_ == (Fl_Widget *)this) {
      Fl_Widget::draw_focus((Fl_Widget *)this);
    }
    iVar5 = Fl_Widget::active_r((Fl_Widget *)this);
    if (iVar5 == 0) {
      FVar6 = fl_inactive(0x27);
      uVar9 = (ulong)FVar6;
    }
    else {
      uVar9 = 0x27;
    }
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,uVar9);
    uVar7 = ((int)uVar7 >> 1) + uVar8;
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0xd])
              (fl_graphics_driver,(ulong)uVar7,(ulong)(uVar10 + uVar11),(ulong)uVar8,(ulong)uVar10,
               (ulong)(uVar11 + uVar8),CONCAT44(uVar12,uVar10));
    iVar5 = Fl_Widget::active_r((Fl_Widget *)this);
    if (iVar5 == 0) {
      FVar6 = fl_inactive(0x36);
      uVar9 = (ulong)FVar6;
    }
    else {
      uVar9 = 0x36;
    }
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,uVar9);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0xc])
              (fl_graphics_driver,(ulong)(uVar11 + uVar8),(ulong)uVar10,(ulong)uVar7,
               (ulong)(uVar10 + uVar11));
    return;
  }
  return;
}

Assistant:

void Fl_Menu_Button::draw() {
  if (!box() || type()) return;
  int H = (labelsize()-3)&-2;
  int X = x()+w()-H-Fl::box_dx(box())-Fl::box_dw(box())-1;
  int Y = y()+(h()-H)/2;
  draw_box(pressed_menu_button_ == this ? fl_down(box()) : box(), color());
  draw_label(x()+Fl::box_dx(box()), y(), X-x()+2, h());
  if (Fl::focus() == this) draw_focus();
  // ** if (box() == FL_FLAT_BOX) return; // for XForms compatibility
  fl_color(active_r() ? FL_DARK3 : fl_inactive(FL_DARK3));
  fl_line(X+H/2, Y+H, X, Y, X+H, Y);
  fl_color(active_r() ? FL_LIGHT3 : fl_inactive(FL_LIGHT3));
  fl_line(X+H, Y, X+H/2, Y+H);
}